

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall cmCacheManager::DeleteCache(cmCacheManager *this,string *path)

{
  bool bVar1;
  string cacheFile;
  string cmakeFiles;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_48,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_48);
  std::__cxx11::string::string((string *)&local_28,(string *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  bVar1 = cmsys::SystemTools::FileExists(local_48._M_dataplus._M_p);
  if (bVar1) {
    cmsys::SystemTools::RemoveFile(&local_48);
    std::__cxx11::string::append((char *)&local_28);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&local_28);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&local_28);
    }
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

bool cmCacheManager::DeleteCache(const std::string& path)
{
  std::string cacheFile = path;
  cmSystemTools::ConvertToUnixSlashes(cacheFile);
  std::string cmakeFiles = cacheFile;
  cacheFile += "/CMakeCache.txt";
  if (cmSystemTools::FileExists(cacheFile.c_str())) {
    cmSystemTools::RemoveFile(cacheFile);
    // now remove the files in the CMakeFiles directory
    // this cleans up language cache files
    cmakeFiles += cmake::GetCMakeFilesDirectory();
    if (cmSystemTools::FileIsDirectory(cmakeFiles)) {
      cmSystemTools::RemoveADirectory(cmakeFiles);
    }
  }
  return true;
}